

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

void __thiscall QRegularExpressionPrivate::cleanCompiledPattern(QRegularExpressionPrivate *this)

{
  pcre2_code_free_16(this->compiledPattern);
  this->compiledPattern = (pcre2_code_16 *)0x0;
  this->errorCode = 0;
  this->errorOffset = -1;
  this->capturingCount = 0;
  this->usingCrLfNewlines = false;
  return;
}

Assistant:

void QRegularExpressionPrivate::cleanCompiledPattern()
{
    pcre2_code_free_16(compiledPattern);
    compiledPattern = nullptr;
    errorCode = 0;
    errorOffset = -1;
    capturingCount = 0;
    usingCrLfNewlines = false;
}